

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

void nifti_free_NBL(nifti_brick_list *NBL)

{
  long lVar1;
  
  if (NBL->bricks != (void **)0x0) {
    for (lVar1 = 0; lVar1 < NBL->nbricks; lVar1 = lVar1 + 1) {
      free(NBL->bricks[lVar1]);
    }
    free(NBL->bricks);
    NBL->bricks = (void **)0x0;
  }
  NBL->nbricks = 0;
  NBL->bsize = 0;
  return;
}

Assistant:

void nifti_free_NBL( nifti_brick_list * NBL )
{
   int c;

   if( NBL->bricks ){
      for( c = 0; c < NBL->nbricks; c++ )
         if( NBL->bricks[c] ) free(NBL->bricks[c]);
      free(NBL->bricks);
      NBL->bricks = NULL;
   }

   NBL->bsize = NBL->nbricks = 0;
}